

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::null_scoped_padder>::format
          (source_location_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_3,memory_buf_t *dest)

{
  bool bVar1;
  uint uVar2;
  memory_buf_t *in_RCX;
  long in_RSI;
  long in_RDI;
  null_scoped_padder p;
  size_t text_size;
  null_scoped_padder p_1;
  undefined7 in_stack_ffffffffffffffa0;
  char in_stack_ffffffffffffffa7;
  string_view_t in_stack_ffffffffffffffa8;
  memory_buf_t *in_stack_ffffffffffffffb8;
  size_t sVar3;
  int n;
  null_scoped_padder local_31;
  memory_buf_t *local_30;
  long local_20;
  char_type *local_10;
  undefined1 *local_8;
  
  local_30 = in_RCX;
  local_20 = in_RSI;
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    null_scoped_padder::null_scoped_padder(&local_31,0,(padding_info *)(in_RDI + 8),local_30);
  }
  else {
    bVar1 = padding_info::enabled((padding_info *)(in_RDI + 8));
    if (bVar1) {
      sVar3 = Catch::clara::std::char_traits<char>::length(*(char_type **)(local_20 + 0x38));
      uVar2 = null_scoped_padder::count_digits<int>(*(int *)(local_20 + 0x40));
      sVar3 = sVar3 + uVar2 + 1;
    }
    else {
      sVar3 = 0;
    }
    null_scoped_padder::null_scoped_padder
              ((null_scoped_padder *)&stack0xffffffffffffffbf,sVar3,(padding_info *)(in_RDI + 8),
               local_30);
    n = (int)(sVar3 >> 0x20);
    local_10 = *(char_type **)(local_20 + 0x38);
    local_8 = &stack0xffffffffffffffa8;
    sVar3 = Catch::clara::std::char_traits<char>::length(local_10);
    fmt_helper::append_string_view
              (in_stack_ffffffffffffffa8,
               (memory_buf_t *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    ::fmt::v8::detail::buffer<char>::push_back
              (&local_30->super_buffer<char>,&stack0xffffffffffffffa7);
    fmt_helper::append_int<int>(n,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        size_t text_size;
        if (padinfo_.enabled())
        {
            // calc text size for padding based on "filename:line"
            text_size = std::char_traits<char>::length(msg.source.filename) + ScopedPadder::count_digits(msg.source.line) + 1;
        }
        else
        {
            text_size = 0;
        }

        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.filename, dest);
        dest.push_back(':');
        fmt_helper::append_int(msg.source.line, dest);
    }